

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O1

FT_Error compute_glyph_metrics(TT_Loader loader,FT_UInt glyph_index)

{
  FT_GlyphSlot pFVar1;
  TT_Face pTVar2;
  long lVar3;
  long lVar4;
  FT_Incremental_GetGlyphMetricsFunc p_Var5;
  uint uVar6;
  FT_Error FVar7;
  FT_Long FVar8;
  ulong uVar9;
  FT_Short *pFVar11;
  FT_Long b_;
  long lVar12;
  long a_;
  FT_Short *pFVar13;
  bool bVar14;
  FT_BBox bbox;
  FT_Incremental_MetricsRec incr_metrics;
  FT_BBox local_78;
  FT_Incremental_MetricsRec local_50;
  FT_Incremental_InterfaceRec *pFVar10;
  
  pFVar1 = loader->glyph;
  b_ = 0x10000;
  if ((loader->load_flags & 1) == 0) {
    b_ = loader->size->metrics->y_scale;
  }
  pTVar2 = loader->face;
  if (pFVar1->format == FT_GLYPH_FORMAT_COMPOSITE) {
    local_78.xMin = (loader->bbox).xMin;
    local_78.yMin = (loader->bbox).yMin;
    local_78.xMax = (loader->bbox).xMax;
    local_78.yMax = (loader->bbox).yMax;
  }
  else {
    FT_Outline_Get_CBox(&pFVar1->outline,&local_78);
  }
  pFVar1->linearHoriAdvance = (long)loader->linear;
  (pFVar1->metrics).horiBearingX = local_78.xMin;
  (pFVar1->metrics).horiBearingY = local_78.yMax;
  if (loader->widthp == (FT_Byte *)0x0) {
    lVar12 = (loader->pp2).x - (loader->pp1).x;
  }
  else {
    lVar12 = (ulong)loader->widthp[glyph_index] << 6;
  }
  (pFVar1->metrics).horiAdvance = lVar12;
  (pFVar1->metrics).width = local_78.xMax - local_78.xMin;
  (pFVar1->metrics).height = local_78.yMax - local_78.yMin;
  if ((pTVar2->vertical_info == '\0') || ((pTVar2->vertical).number_Of_VMetrics == 0)) {
    FVar8 = FT_DivFix(local_78.yMax - local_78.yMin,b_);
    bVar14 = (pTVar2->os2).version == 0xffff;
    pFVar11 = &(pTVar2->os2).sTypoAscender;
    if (bVar14) {
      pFVar11 = &(pTVar2->horizontal).Ascender;
    }
    pFVar13 = &(pTVar2->horizontal).Descender;
    if (!bVar14) {
      pFVar13 = &(pTVar2->os2).sTypoDescender;
    }
    uVar9 = (long)*pFVar11 - (long)*pFVar13;
    lVar12 = uVar9 - (long)(short)FVar8;
    lVar12 = (long)((int)lVar12 - (int)(lVar12 >> 0x3f) >> 1);
  }
  else {
    FVar8 = FT_DivFix((loader->pp3).y - local_78.yMax,b_);
    lVar12 = (long)(short)FVar8;
    lVar3 = (loader->pp3).y;
    lVar4 = (loader->pp4).y;
    a_ = lVar3 - lVar4;
    if (a_ == 0 || lVar3 < lVar4) {
      uVar9 = 0;
    }
    else {
      uVar9 = FT_DivFix(a_,b_);
      uVar9 = uVar9 & 0xffff;
    }
  }
  pFVar10 = ((pTVar2->root).internal)->incremental_interface;
  bVar14 = true;
  local_50.bearing_y = lVar12;
  local_50.advance = uVar9;
  if ((pFVar10 != (FT_Incremental_InterfaceRec *)0x0) &&
     (p_Var5 = pFVar10->funcs->get_glyph_metrics, p_Var5 != (FT_Incremental_GetGlyphMetricsFunc)0x0)
     ) {
    local_50.bearing_x = 0;
    uVar6 = (*p_Var5)(pFVar10->object,glyph_index,'\x01',&local_50);
    pFVar10 = (FT_Incremental_InterfaceRec *)(ulong)uVar6;
    if (uVar6 != 0) {
      bVar14 = false;
      local_50.bearing_y = lVar12;
      local_50.advance = uVar9;
    }
  }
  FVar7 = (FT_Error)pFVar10;
  if (bVar14) {
    pFVar1->linearVertAdvance = local_50.advance;
    if ((loader->load_flags & 1) == 0) {
      lVar12 = (long)(int)local_50.bearing_y * (long)(int)b_;
      local_50.bearing_y = (FT_Long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      lVar12 = (long)(int)local_50.advance * (long)(int)b_;
      local_50.advance = (FT_Long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
    }
    (pFVar1->metrics).vertBearingX =
         (pFVar1->metrics).horiBearingX - (pFVar1->metrics).horiAdvance / 2;
    (pFVar1->metrics).vertBearingY = local_50.bearing_y;
    (pFVar1->metrics).vertAdvance = local_50.advance;
    FVar7 = 0;
  }
  return FVar7;
}

Assistant:

static FT_Error
  compute_glyph_metrics( TT_Loader  loader,
                         FT_UInt    glyph_index )
  {
    TT_Face       face  = loader->face;
    TT_Size       size  = loader->size;
    TT_GlyphSlot  glyph = loader->glyph;
    FT_BBox       bbox;
    FT_Fixed      y_scale;


    y_scale = 0x10000L;
    if ( ( loader->load_flags & FT_LOAD_NO_SCALE ) == 0 )
      y_scale = size->metrics->y_scale;

    if ( glyph->format != FT_GLYPH_FORMAT_COMPOSITE )
      FT_Outline_Get_CBox( &glyph->outline, &bbox );
    else
      bbox = loader->bbox;

    /* get the device-independent horizontal advance; it is scaled later */
    /* by the base layer.                                                */
    glyph->linearHoriAdvance = loader->linear;

    glyph->metrics.horiBearingX = bbox.xMin;
    glyph->metrics.horiBearingY = bbox.yMax;
    if ( loader->widthp )
      glyph->metrics.horiAdvance = loader->widthp[glyph_index] * 64;
    else
      glyph->metrics.horiAdvance = SUB_LONG( loader->pp2.x, loader->pp1.x );

    /* set glyph dimensions */
    glyph->metrics.width  = SUB_LONG( bbox.xMax, bbox.xMin );
    glyph->metrics.height = SUB_LONG( bbox.yMax, bbox.yMin );

    /* Now take care of vertical metrics.  In the case where there is */
    /* no vertical information within the font (relatively common),   */
    /* create some metrics manually                                   */
    {
      FT_Pos  top;      /* scaled vertical top side bearing  */
      FT_Pos  advance;  /* scaled vertical advance height    */


      /* Get the unscaled top bearing and advance height. */
      if ( face->vertical_info                   &&
           face->vertical.number_Of_VMetrics > 0 )
      {
        top = (FT_Short)FT_DivFix( SUB_LONG( loader->pp3.y, bbox.yMax ),
                                   y_scale );

        if ( loader->pp3.y <= loader->pp4.y )
          advance = 0;
        else
          advance = (FT_UShort)FT_DivFix( SUB_LONG( loader->pp3.y,
                                                    loader->pp4.y ),
                                          y_scale );
      }
      else
      {
        FT_Pos  height;


        /* XXX Compute top side bearing and advance height in  */
        /*     Get_VMetrics instead of here.                   */

        /* NOTE: The OS/2 values are the only `portable' ones, */
        /*       which is why we use them, if there is an OS/2 */
        /*       table in the font.  Otherwise, we use the     */
        /*       values defined in the horizontal header.      */

        height = (FT_Short)FT_DivFix( SUB_LONG( bbox.yMax,
                                                bbox.yMin ),
                                      y_scale );
        if ( face->os2.version != 0xFFFFU )
          advance = (FT_Pos)( face->os2.sTypoAscender -
                              face->os2.sTypoDescender );
        else
          advance = (FT_Pos)( face->horizontal.Ascender -
                              face->horizontal.Descender );

        top = ( advance - height ) / 2;
      }

#ifdef FT_CONFIG_OPTION_INCREMENTAL
      {
        FT_Incremental_InterfaceRec*  incr;
        FT_Incremental_MetricsRec     incr_metrics;
        FT_Error                      error;


        incr = face->root.internal->incremental_interface;

        /* If this is an incrementally loaded font see if there are */
        /* overriding metrics for this glyph.                       */
        if ( incr && incr->funcs->get_glyph_metrics )
        {
          incr_metrics.bearing_x = 0;
          incr_metrics.bearing_y = top;
          incr_metrics.advance   = advance;

          error = incr->funcs->get_glyph_metrics( incr->object,
                                                  glyph_index,
                                                  TRUE,
                                                  &incr_metrics );
          if ( error )
            return error;

          top     = incr_metrics.bearing_y;
          advance = incr_metrics.advance;
        }
      }

      /* GWW: Do vertical metrics get loaded incrementally too? */

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

      glyph->linearVertAdvance = advance;

      /* scale the metrics */
      if ( !( loader->load_flags & FT_LOAD_NO_SCALE ) )
      {
        top     = FT_MulFix( top,     y_scale );
        advance = FT_MulFix( advance, y_scale );
      }

      /* XXX: for now, we have no better algorithm for the lsb, but it */
      /*      should work fine.                                        */
      /*                                                               */
      glyph->metrics.vertBearingX = SUB_LONG( glyph->metrics.horiBearingX,
                                              glyph->metrics.horiAdvance / 2 );
      glyph->metrics.vertBearingY = top;
      glyph->metrics.vertAdvance  = advance;
    }

    return FT_Err_Ok;
  }